

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcc.hpp
# Opt level: O2

void __thiscall cppjit::builder::gcc::gcc(gcc *this,string *kernel_name)

{
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  string *local_38;
  
  builder::builder(&this->super_builder,kernel_name,false);
  (this->super_builder)._vptr_builder = (_func_int **)&PTR_compile_impl_00108c80;
  std::__cxx11::string::string((string *)&this->compiler,"g++",&local_39);
  local_38 = &this->compiler;
  std::__cxx11::string::string((string *)&this->linker,"g++",&local_3a);
  std::__cxx11::string::string
            ((string *)&this->cpp_flags,"-std=c++14 -fPIC -fno-gnu-unique",&local_3b);
  std::__cxx11::string::string((string *)&this->link_flags,"-shared -fno-gnu-unique",&local_3c);
  std::__cxx11::string::string((string *)&this->include_paths,"",&local_3d);
  std::__cxx11::string::string((string *)&this->library_paths,"",&local_3e);
  std::__cxx11::string::string((string *)&this->libraries,"",&local_3f);
  return;
}

Assistant:

gcc(const std::string &kernel_name) : builder(kernel_name) {}